

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csg.cpp
# Opt level: O3

void __thiscall ocmesh::details::intersection_t::dump(intersection_t *this,ostream *o)

{
  object *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"intersect(",10);
  poVar1 = (this->super_binary_operation_t)._left;
  (*poVar1->_vptr_object[4])(poVar1,o);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  poVar1 = (this->super_binary_operation_t)._right;
  (*poVar1->_vptr_object[4])(poVar1,o);
  std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
  return;
}

Assistant:

void intersection_t::dump(std::ostream &o) const {
            o << "intersect(";
            left()->dump(o);
            o << ", ";
            right()->dump(o);
            o << ")";
        }